

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O2

bool covenant::intersect_unorder_ord<covenant::Sym>
               (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *unord_s,
               vector<covenant::Sym,_std::allocator<covenant::Sym>_> *ord_s)

{
  pointer pSVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = 0;
  do {
    uVar5 = (ulong)uVar3;
    pSVar1 = (unord_s->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (long)(unord_s->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 2;
    if (uVar4 <= uVar5) break;
    bVar2 = std::
            binary_search<__gnu_cxx::__normal_iterator<covenant::Sym*,std::vector<covenant::Sym,std::allocator<covenant::Sym>>>,covenant::Sym>
                      ((ord_s->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>).
                       _M_impl.super__Vector_impl_data._M_start,
                       (ord_s->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>).
                       _M_impl.super__Vector_impl_data._M_finish,pSVar1 + uVar5);
    uVar3 = uVar3 + 1;
  } while (!bVar2);
  return uVar5 < uVar4;
}

Assistant:

bool intersect_unorder_ord(vector<T> unord_s, vector<T> ord_s){
    for (unsigned i=0; i < unord_s.size(); i++){
      if (binary_search(ord_s.begin(), ord_s.end(), unord_s[i]))
	return true;
    }
    return false;
  }